

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall TPZMatrix<TPZFlopCounter>::Decompose_LU(TPZMatrix<TPZFlopCounter> *this)

{
  TPZFlopCounter *pTVar1;
  bool bVar2;
  int64_t iVar3;
  int64_t iVar4;
  TPZBaseMatrix *in_RDI;
  int64_t j;
  int64_t i;
  int64_t k;
  int64_t min;
  TPZFlopCounter pivot;
  TPZFlopCounter nn;
  char *in_stack_00000148;
  char *in_stack_00000150;
  TPZFlopCounter in_stack_ffffffffffffff50;
  TPZFlopCounter *in_stack_ffffffffffffff58;
  int64_t local_98;
  REAL local_68;
  TPZFlopCounter *local_60;
  REAL local_50;
  TPZFlopCounter *local_48;
  TPZFlopCounter *local_30;
  int64_t local_28;
  TPZFlopCounter local_20;
  TPZFlopCounter local_18 [3];
  
  if ((in_RDI->fDecomposed != '\0') && (in_RDI->fDecomposed != '\x01')) {
    Error(in_stack_00000150,in_stack_00000148);
  }
  if (in_RDI->fDecomposed == '\0') {
    TPZFlopCounter::TPZFlopCounter(local_18);
    TPZFlopCounter::TPZFlopCounter(&local_20);
    iVar3 = TPZBaseMatrix::Cols(in_RDI);
    iVar4 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar3 < iVar4) {
      local_98 = TPZBaseMatrix::Cols(in_RDI);
    }
    else {
      local_98 = TPZBaseMatrix::Rows(in_RDI);
    }
    local_28 = local_98;
    for (local_30 = (TPZFlopCounter *)0x0; (long)local_30 < local_28;
        local_30 = (TPZFlopCounter *)((long)&local_30->fVal + 1)) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_30,local_30);
      bVar2 = IsZero<TPZFlopCounter>(in_stack_ffffffffffffff50);
      pTVar1 = local_30;
      if (bVar2) {
        Error(in_stack_00000150,in_stack_00000148);
        pTVar1 = local_30;
      }
      while( true ) {
        local_48 = (TPZFlopCounter *)((long)&pTVar1->fVal + 1);
        pTVar1 = local_48;
        iVar3 = TPZBaseMatrix::Rows(in_RDI);
        if (iVar3 <= (long)pTVar1) break;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_48,local_30);
        local_50 = (REAL)TPZFlopCounter::operator/
                                   (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50.fVal);
        local_18[0] = (TPZFlopCounter)local_50;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_48,local_30,local_18);
        local_60 = local_30;
        while( true ) {
          local_60 = (TPZFlopCounter *)((long)&local_60->fVal + 1);
          in_stack_ffffffffffffff58 = local_60;
          iVar3 = TPZBaseMatrix::Cols(in_RDI);
          pTVar1 = local_48;
          if (iVar3 <= (long)in_stack_ffffffffffffff58) break;
          in_stack_ffffffffffffff50.fVal = (REAL)local_60;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_48,local_60);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_30,local_60);
          TPZFlopCounter::operator*
                    (in_stack_ffffffffffffff58,(TPZFlopCounter *)in_stack_ffffffffffffff50.fVal);
          local_68 = (REAL)TPZFlopCounter::operator-
                                     (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50.fVal);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                    (in_RDI,pTVar1,in_stack_ffffffffffffff50.fVal,&local_68);
        }
      }
    }
    in_RDI->fDecomposed = '\x01';
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LU() {
	
	if (  fDecomposed && fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
	if (fDecomposed) return 1;
	
	TVar nn, pivot;
	int64_t  min = ( Cols() < (Rows()) ) ? Cols() : Rows();
	
	for ( int64_t k = 0; k < min ; k++ ) {
		if (IsZero( pivot = GetVal(k, k))) Error( "Decompose_LU <matrix is singular>" );
		for ( int64_t i = k+1; i < Rows(); i++ ) {
			nn = GetVal( i, k ) / pivot;
			PutVal( i, k, nn );
			for ( int64_t j = k+1; j < Cols(); j++ ) PutVal(i,j,GetVal(i,j)-nn*GetVal(k,j));
		}
	}
	fDecomposed=ELU;
	return 1;
}